

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

void __thiscall LexicalAnalyzer::lookingForEndOfStatement(LexicalAnalyzer *this,string *str)

{
  pointer pcVar1;
  ostream *poVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  uVar5 = 0;
  bVar4 = false;
  do {
    if (pcVar1[uVar5] != ' ') {
      cVar3 = (char)&this->m_Statement;
      if (pcVar1[uVar5] == ';') {
        std::__cxx11::string::push_back(cVar3);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->m_Statement);
        std::endl<char,std::char_traits<char>>(poVar2);
        return;
      }
      if (bVar4) {
        std::__cxx11::string::push_back(cVar3);
        pcVar1 = (str->_M_dataplus)._M_p;
      }
      bVar4 = (bool)(bVar4 | pcVar1[uVar5] == '{');
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::lookingForEndOfStatement(string str){
    unsigned index = 0;
    bool fOpened = false;
    for(index; ;index++){
        if(str[index] == ' ')
            continue;
        if(str[index] == ';'){
            m_Statement.push_back(str[index]);
            break;
        }

        if(fOpened)
            m_Statement.push_back(str[index]);
        if(str[index] == '{')
            fOpened = true;
    }
    cout << m_Statement << endl;
    return;
}